

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_sse2.h
# Opt level: O2

void transpose_16bit_8x8(__m128i *in,__m128i *out)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  longlong lVar9;
  undefined4 uVar10;
  undefined4 uVar13;
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined4 uVar24;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined4 uVar33;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  undefined1 auVar14 [12];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar34 [12];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  alVar1 = *in;
  alVar2 = in[2];
  auVar19._0_12_ = alVar1._0_12_;
  auVar19._12_2_ = alVar1[0]._6_2_;
  auVar19._14_2_ = *(undefined2 *)((long)in[1] + 6);
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._0_10_ = alVar1._0_10_;
  auVar18._10_2_ = *(undefined2 *)((long)in[1] + 4);
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._0_8_ = alVar1[0];
  auVar17._8_2_ = alVar1[0]._4_2_;
  auVar5._4_8_ = auVar17._8_8_;
  auVar5._2_2_ = *(undefined2 *)((long)in[1] + 2);
  auVar5._0_2_ = alVar1[0]._2_2_;
  auVar16._0_4_ = CONCAT22((short)in[1][0],(short)alVar1[0]);
  auVar16._4_12_ = auVar5;
  auVar31._0_12_ = alVar2._0_12_;
  auVar31._12_2_ = alVar2[0]._6_2_;
  auVar31._14_2_ = *(undefined2 *)((long)in[3] + 6);
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._0_10_ = alVar2._0_10_;
  auVar30._10_2_ = *(undefined2 *)((long)in[3] + 4);
  auVar29._10_6_ = auVar30._10_6_;
  auVar29._0_8_ = alVar2[0];
  auVar29._8_2_ = alVar2[0]._4_2_;
  auVar6._4_8_ = auVar29._8_8_;
  auVar6._2_2_ = *(undefined2 *)((long)in[3] + 2);
  auVar6._0_2_ = alVar2[0]._2_2_;
  alVar3 = in[4];
  auVar23._0_12_ = alVar3._0_12_;
  auVar23._12_2_ = alVar3[0]._6_2_;
  auVar23._14_2_ = *(undefined2 *)((long)in[5] + 6);
  auVar22._12_4_ = auVar23._12_4_;
  auVar22._0_10_ = alVar3._0_10_;
  auVar22._10_2_ = *(undefined2 *)((long)in[5] + 4);
  auVar21._10_6_ = auVar22._10_6_;
  auVar21._0_8_ = alVar3[0];
  auVar21._8_2_ = alVar3[0]._4_2_;
  auVar7._4_8_ = auVar21._8_8_;
  auVar7._2_2_ = *(undefined2 *)((long)in[5] + 2);
  auVar7._0_2_ = alVar3[0]._2_2_;
  auVar20._0_4_ = CONCAT22((short)in[5][0],(short)alVar3[0]);
  auVar20._4_12_ = auVar7;
  alVar4 = in[6];
  lVar9 = in[7][0];
  auVar39._0_12_ = alVar4._0_12_;
  auVar39._12_2_ = alVar4[0]._6_2_;
  auVar39._14_2_ = *(undefined2 *)((long)in[7] + 6);
  auVar38._12_4_ = auVar39._12_4_;
  auVar38._0_10_ = alVar4._0_10_;
  auVar38._10_2_ = *(undefined2 *)((long)in[7] + 4);
  auVar37._10_6_ = auVar38._10_6_;
  auVar37._0_8_ = alVar4[0];
  auVar37._8_2_ = alVar4[0]._4_2_;
  auVar8._4_8_ = auVar37._8_8_;
  auVar8._2_2_ = *(undefined2 *)((long)in[7] + 2);
  auVar8._0_2_ = alVar4[0]._2_2_;
  uVar10 = CONCAT22((short)in[1][1],(short)alVar1[1]);
  auVar11._0_8_ = CONCAT26(*(undefined2 *)((long)in[1] + 10),CONCAT24(alVar1[1]._2_2_,uVar10));
  auVar11._8_2_ = alVar1[1]._4_2_;
  auVar11._10_2_ = *(undefined2 *)((long)in[1] + 0xc);
  auVar12._12_2_ = alVar1[1]._6_2_;
  auVar12._0_12_ = auVar11;
  auVar12._14_2_ = *(undefined2 *)((long)in[1] + 0xe);
  uVar24 = CONCAT22((short)in[3][1],(short)alVar2[1]);
  auVar25._0_8_ = CONCAT26(*(undefined2 *)((long)in[3] + 10),CONCAT24(alVar2[1]._2_2_,uVar24));
  auVar25._8_2_ = alVar2[1]._4_2_;
  auVar25._10_2_ = *(undefined2 *)((long)in[3] + 0xc);
  auVar26._12_2_ = alVar2[1]._6_2_;
  auVar26._0_12_ = auVar25;
  auVar26._14_2_ = *(undefined2 *)((long)in[3] + 0xe);
  uVar13 = CONCAT22((short)in[5][1],(short)alVar3[1]);
  auVar14._0_8_ = CONCAT26(*(undefined2 *)((long)in[5] + 10),CONCAT24(alVar3[1]._2_2_,uVar13));
  auVar14._8_2_ = alVar3[1]._4_2_;
  auVar14._10_2_ = *(undefined2 *)((long)in[5] + 0xc);
  auVar15._12_2_ = alVar3[1]._6_2_;
  auVar15._0_12_ = auVar14;
  auVar15._14_2_ = *(undefined2 *)((long)in[5] + 0xe);
  uVar33 = CONCAT22((short)in[7][1],(short)alVar4[1]);
  auVar34._0_8_ = CONCAT26(*(undefined2 *)((long)in[7] + 10),CONCAT24(alVar4[1]._2_2_,uVar33));
  auVar34._8_2_ = alVar4[1]._4_2_;
  auVar34._10_2_ = *(undefined2 *)((long)in[7] + 0xc);
  auVar35._12_2_ = alVar4[1]._6_2_;
  auVar35._0_12_ = auVar34;
  auVar35._14_2_ = *(undefined2 *)((long)in[7] + 0xe);
  auVar27._0_8_ = auVar16._0_8_;
  auVar27._8_4_ = auVar5._0_4_;
  auVar27._12_4_ = auVar6._0_4_;
  auVar28._0_8_ = auVar20._0_8_;
  auVar28._8_4_ = auVar7._0_4_;
  auVar28._12_4_ = auVar8._0_4_;
  auVar32._8_4_ = (int)((ulong)auVar11._0_8_ >> 0x20);
  auVar32._0_8_ = auVar11._0_8_;
  auVar32._12_4_ = (int)((ulong)auVar25._0_8_ >> 0x20);
  auVar36._8_4_ = (int)((ulong)auVar14._0_8_ >> 0x20);
  auVar36._0_8_ = auVar14._0_8_;
  auVar36._12_4_ = (int)((ulong)auVar34._0_8_ >> 0x20);
  (*out)[0] = CONCAT44(CONCAT22((short)in[3][0],(short)alVar2[0]),auVar16._0_4_);
  (*out)[1] = CONCAT44(CONCAT22((short)lVar9,(short)alVar4[0]),auVar20._0_4_);
  out[1][0] = auVar27._8_8_;
  out[1][1] = auVar28._8_8_;
  *(int *)out[2] = auVar17._8_4_;
  *(int *)((long)out[2] + 4) = auVar29._8_4_;
  *(int *)(out[2] + 1) = auVar21._8_4_;
  *(int *)((long)out[2] + 0xc) = auVar37._8_4_;
  *(undefined4 *)(out[3] + 1) = auVar18._12_4_;
  *(undefined4 *)((long)out[3] + 0xc) = auVar30._12_4_;
  *(undefined4 *)out[4] = auVar22._12_4_;
  *(undefined4 *)((long)out[4] + 4) = auVar38._12_4_;
  out[4][0] = CONCAT44(uVar24,uVar10);
  out[4][1] = CONCAT44(uVar33,uVar13);
  out[5][0] = auVar32._8_8_;
  out[5][1] = auVar36._8_8_;
  *(int *)out[6] = auVar11._8_4_;
  *(int *)((long)out[6] + 4) = auVar25._8_4_;
  *(int *)(out[6] + 1) = auVar14._8_4_;
  *(int *)((long)out[6] + 0xc) = auVar34._8_4_;
  *(int *)(out[7] + 1) = auVar12._12_4_;
  *(int *)((long)out[7] + 0xc) = auVar26._12_4_;
  *(int *)out[8] = auVar15._12_4_;
  *(int *)((long)out[8] + 4) = auVar35._12_4_;
  return;
}

Assistant:

static inline void transpose_16bit_8x8(const __m128i *const in,
                                       __m128i *const out) {
  // Unpack 16 bit elements. Goes from:
  // in[0]: 00 01 02 03  04 05 06 07
  // in[1]: 10 11 12 13  14 15 16 17
  // in[2]: 20 21 22 23  24 25 26 27
  // in[3]: 30 31 32 33  34 35 36 37
  // in[4]: 40 41 42 43  44 45 46 47
  // in[5]: 50 51 52 53  54 55 56 57
  // in[6]: 60 61 62 63  64 65 66 67
  // in[7]: 70 71 72 73  74 75 76 77
  // to:
  // a0:    00 10 01 11  02 12 03 13
  // a1:    20 30 21 31  22 32 23 33
  // a2:    40 50 41 51  42 52 43 53
  // a3:    60 70 61 71  62 72 63 73
  // a4:    04 14 05 15  06 16 07 17
  // a5:    24 34 25 35  26 36 27 37
  // a6:    44 54 45 55  46 56 47 57
  // a7:    64 74 65 75  66 76 67 77
  const __m128i a0 = _mm_unpacklo_epi16(in[0], in[1]);
  const __m128i a1 = _mm_unpacklo_epi16(in[2], in[3]);
  const __m128i a2 = _mm_unpacklo_epi16(in[4], in[5]);
  const __m128i a3 = _mm_unpacklo_epi16(in[6], in[7]);
  const __m128i a4 = _mm_unpackhi_epi16(in[0], in[1]);
  const __m128i a5 = _mm_unpackhi_epi16(in[2], in[3]);
  const __m128i a6 = _mm_unpackhi_epi16(in[4], in[5]);
  const __m128i a7 = _mm_unpackhi_epi16(in[6], in[7]);

  // Unpack 32 bit elements resulting in:
  // b0: 00 10 20 30  01 11 21 31
  // b1: 40 50 60 70  41 51 61 71
  // b2: 04 14 24 34  05 15 25 35
  // b3: 44 54 64 74  45 55 65 75
  // b4: 02 12 22 32  03 13 23 33
  // b5: 42 52 62 72  43 53 63 73
  // b6: 06 16 26 36  07 17 27 37
  // b7: 46 56 66 76  47 57 67 77
  const __m128i b0 = _mm_unpacklo_epi32(a0, a1);
  const __m128i b1 = _mm_unpacklo_epi32(a2, a3);
  const __m128i b2 = _mm_unpacklo_epi32(a4, a5);
  const __m128i b3 = _mm_unpacklo_epi32(a6, a7);
  const __m128i b4 = _mm_unpackhi_epi32(a0, a1);
  const __m128i b5 = _mm_unpackhi_epi32(a2, a3);
  const __m128i b6 = _mm_unpackhi_epi32(a4, a5);
  const __m128i b7 = _mm_unpackhi_epi32(a6, a7);

  // Unpack 64 bit elements resulting in:
  // out[0]: 00 10 20 30  40 50 60 70
  // out[1]: 01 11 21 31  41 51 61 71
  // out[2]: 02 12 22 32  42 52 62 72
  // out[3]: 03 13 23 33  43 53 63 73
  // out[4]: 04 14 24 34  44 54 64 74
  // out[5]: 05 15 25 35  45 55 65 75
  // out[6]: 06 16 26 36  46 56 66 76
  // out[7]: 07 17 27 37  47 57 67 77
  out[0] = _mm_unpacklo_epi64(b0, b1);
  out[1] = _mm_unpackhi_epi64(b0, b1);
  out[2] = _mm_unpacklo_epi64(b4, b5);
  out[3] = _mm_unpackhi_epi64(b4, b5);
  out[4] = _mm_unpacklo_epi64(b2, b3);
  out[5] = _mm_unpackhi_epi64(b2, b3);
  out[6] = _mm_unpacklo_epi64(b6, b7);
  out[7] = _mm_unpackhi_epi64(b6, b7);
}